

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O1

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_39da45::import_strings_parser
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          transaction *transaction,string_mapping *names)

{
  callbacks local_48;
  callbacks local_38;
  not_null<pstore::database_*> local_28;
  
  local_28.ptr_ = (transaction->super_transaction_base).db_;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_28);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::strings_array_members,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*>
            (&local_38,local_28,transaction,names);
  local_48.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.context_.
  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_38.context_.
          super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_38.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.context_.
            super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.context_.
       super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.context_.
            super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::parser
            (__return_storage_ptr__,&local_48,none);
  if (local_48.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38.context_.
      super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.context_.
               super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

decltype (auto)
    import_strings_parser (transaction * const transaction,
                           pstore::exchange::import_ns::string_mapping * const names) {
        return make_json_array_parser<pstore::exchange::import_ns::strings_array_members> (
            &transaction->db (), transaction, names);
    }